

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall
dgPolyhedra::ConvexPartition
          (dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes,dgPolyhedra *leftOversOut)

{
  ulong uVar1;
  int *piVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  dgEdge *pdVar6;
  dgRedBackNode *pdVar7;
  undefined1 auVar8 [32];
  dgTree<dgEdge,_long> *pdVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  HaI32 HVar46;
  bool bVar47;
  int stride;
  dgEdge *pdVar48;
  dgEdge *pdVar49;
  dgRedBackNode *pdVar50;
  uint uVar51;
  long lVar52;
  dgEdge *pdVar53;
  dgTreeNode *pdVar54;
  long lVar55;
  dgRedBackNode *pdVar56;
  long lVar57;
  int iVar58;
  dgEdge *pdVar59;
  dgPolyhedra *this_00;
  undefined8 uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  int *piVar65;
  uint uVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  float fVar81;
  double dVar82;
  double dVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  Iterator IVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  Iterator iter_2;
  dgPolyhedra flatFace;
  Iterator iter;
  Iterator iter_3;
  dgPolyhedra buildConvex;
  Iterator iter_1;
  HaI32 polygon [8192];
  dgEdge *diagonalsPool [8192];
  Iterator IStack_1a140;
  dgPolyhedra dStack_1a130;
  Iterator IStack_1a108;
  undefined1 auStack_1a0f8 [16];
  undefined1 auStack_1a0e8 [32];
  dgPolyhedra *pdStack_1a0c0;
  Iterator IStack_1a0b8;
  undefined1 auStack_1a0a8 [16];
  undefined1 auStack_1a098 [16];
  ulong uStack_1a080;
  ulong uStack_1a078;
  undefined8 uStack_1a070;
  dgPolyhedra dStack_1a060;
  dgBigVector adStack_1a038 [256];
  HaI32 HStack_18038;
  int aiStack_18034 [8191];
  long alStack_10038 [8193];
  
  if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
    Triangulate(this,vertex,strideInBytes,leftOversOut);
    DeleteDegenerateFaces(this,vertex,strideInBytes,9.999999747378752e-06);
    Optimize(this,vertex,strideInBytes,9.999999747378752e-05);
    DeleteDegenerateFaces(this,vertex,strideInBytes,9.999999747378752e-06);
    if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
      dgPolyhedra(&dStack_1a060);
      IStack_1a108.m_ptr = (dgRedBackNode *)0x0;
      pdVar54 = (this->super_dgTree<dgEdge,_long>).m_head;
      IStack_1a108.m_tree = &this->super_dgTree<dgEdge,_long>;
      if ((pdVar54 != (dgTreeNode *)0x0) &&
         (IStack_1a108.m_ptr = dgRedBackNode::Minimum(&pdVar54->super_dgRedBackNode),
         IStack_1a108.m_ptr != (dgRedBackNode *)0x0)) {
        stride = strideInBytes >> 3;
        pdStack_1a0c0 = this;
        do {
          pdVar50 = IStack_1a108.m_ptr;
          dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a108,0);
          if (0 < *(int *)((long)&pdVar50[1]._vptr_dgRedBackNode + 4)) {
            dgPolyhedra(&dStack_1a130);
            MarkAdjacentCoplanarFaces
                      (this,&dStack_1a130,(dgEdge *)(pdVar50 + 1),vertex,strideInBytes);
            if (dStack_1a130.super_dgTree<dgEdge,_long>.m_count != 0) {
              RefineTriangulation(&dStack_1a130,vertex,stride);
              iVar58 = dStack_1a130.m_edgeMark + 1;
              dStack_1a130.m_edgeMark = iVar58;
              if (iVar58 == 0x7fffffff) goto LAB_008604b0;
              lVar57 = (long)stride;
              IStack_1a140.m_tree = &dStack_1a130.super_dgTree<dgEdge,_long>;
              if ((dStack_1a130.super_dgTree<dgEdge,_long>.m_head != (dgTreeNode *)0x0) &&
                 (IStack_1a140.m_ptr =
                       dgRedBackNode::Minimum
                                 (&(dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->
                                   super_dgRedBackNode), IStack_1a140.m_ptr != (dgRedBackNode *)0x0)
                 ) {
                uVar66 = 0;
                do {
                  if ((*(int *)((long)&IStack_1a140.m_ptr[1]._vptr_dgRedBackNode + 4) < 0) &&
                     (*(int *)&IStack_1a140.m_ptr[2]._vptr_dgRedBackNode != iVar58)) {
                    pdVar56 = IStack_1a140.m_ptr + 1;
                    pdVar50 = pdVar56;
                    do {
                      *(int *)&pdVar50[1]._vptr_dgRedBackNode = iVar58;
                      pdVar50 = pdVar50->m_right;
                    } while (pdVar50 != pdVar56);
                    (&adStack_1a038[0].super_dgTemplateVector<double>.m_x)[(int)uVar66] =
                         (double)pdVar56;
                    if (0x3fe < (int)uVar66) {
                      __assert_fail("perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0]))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xddf,
                                    "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                   );
                    }
                    uVar66 = uVar66 + 1;
                  }
                  dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a140,0);
                } while (IStack_1a140.m_ptr != (dgRedBackNode *)0x0);
                if (0 < (int)uVar66) {
                  uStack_1a080 = (ulong)uVar66;
                  uVar67 = 0;
LAB_0085f423:
                  pdVar48 = (dgEdge *)(&adStack_1a038[0].super_dgTemplateVector<double>.m_x)[uVar67]
                  ;
                  lVar52 = pdVar48->m_incidentVertex * lVar57;
                  dVar3 = (double)vertex[lVar52 + 2];
                  auVar68._8_4_ = 0xffffffff;
                  auVar68._0_8_ = 0x7fffffffffffffff;
                  auVar68._12_4_ = 0x7fffffff;
                  auVar68 = vpandq_avx512vl(*(undefined1 (*) [16])(vertex + lVar52),auVar68);
                  auVar69._8_4_ = 0xffffffff;
                  auVar69._0_8_ = 0x7fefffffffffffff;
                  auVar69._12_4_ = 0x7fefffff;
                  uVar64 = vpcmpgtq_avx512vl(auVar68,auVar69);
                  if (((((uVar64 & 1) == 0) && ((uVar64 & 3) >> 1 == 0)) &&
                      (!NAN((double)vertex[lVar52 + 1]))) &&
                     (((ulong)ABS(dVar3) < 0x7ff0000000000000 && (!NAN(dVar3))))) {
                    auVar68 = vcvtpd2ps_avx(*(undefined1 (*) [16])(vertex + lVar52));
                    auVar70._8_4_ = 0x7fffffff;
                    auVar70._0_8_ = 0x7fffffff7fffffff;
                    auVar70._12_4_ = 0x7fffffff;
                    auVar69 = vpandd_avx512vl(auVar68,auVar70);
                    auVar15._8_4_ = 0x7f7fffff;
                    auVar15._0_8_ = 0x7f7fffff7f7fffff;
                    auVar15._12_4_ = 0x7f7fffff;
                    uVar64 = vpcmpgtd_avx512vl(auVar69,auVar15);
                    fVar77 = (float)dVar3;
                    if (((((uVar64 & 1) == 0) &&
                         ((((uVar64 & 0xf) >> 1 & 1) == 0 &&
                          (auVar69 = vmovshdup_avx(auVar68), !NAN(auVar69._0_4_))))) &&
                        ((uint)ABS(fVar77) < 0x7f800000)) && (!NAN(fVar77))) {
                      lVar52 = pdVar48->m_next->m_incidentVertex * lVar57;
                      dVar3 = (double)vertex[lVar52 + 2];
                      auVar16._8_4_ = 0xffffffff;
                      auVar16._0_8_ = 0x7fffffffffffffff;
                      auVar16._12_4_ = 0x7fffffff;
                      auVar69 = vpandq_avx512vl(*(undefined1 (*) [16])(vertex + lVar52),auVar16);
                      auVar17._8_4_ = 0xffffffff;
                      auVar17._0_8_ = 0x7fefffffffffffff;
                      auVar17._12_4_ = 0x7fefffff;
                      uVar64 = vpcmpgtq_avx512vl(auVar69,auVar17);
                      if (((((uVar64 & 1) != 0) || ((uVar64 & 3) >> 1 != 0)) ||
                          (NAN((double)vertex[lVar52 + 1]))) ||
                         ((0x7fefffffffffffff < (ulong)ABS(dVar3) || (NAN(dVar3)))))
                      goto LAB_008603f3;
                      fVar95 = (float)dVar3;
                      auVar69 = vcvtpd2ps_avx(*(undefined1 (*) [16])(vertex + lVar52));
                      auVar18._8_4_ = 0x7fffffff;
                      auVar18._0_8_ = 0x7fffffff7fffffff;
                      auVar18._12_4_ = 0x7fffffff;
                      auVar70 = vpandd_avx512vl(auVar69,auVar18);
                      auVar19._8_4_ = 0x7f7fffff;
                      auVar19._0_8_ = 0x7f7fffff7f7fffff;
                      auVar19._12_4_ = 0x7f7fffff;
                      uVar64 = vpcmpgtd_avx512vl(auVar70,auVar19);
                      auStack_1a0e8._0_16_ = auVar69;
                      if ((((uVar64 & 1) == 0) &&
                          ((((uVar64 & 0xf) >> 1 & 1) == 0 &&
                           (auVar70 = vmovshdup_avx(auVar69), !NAN(auVar70._0_4_))))) &&
                         (((uint)ABS(fVar95) < 0x7f800000 && (!NAN(fVar95))))) {
                        auVar68 = vsubps_avx(auVar69,auVar68);
                        auVar20._8_4_ = 0x7fffffff;
                        auVar20._0_8_ = 0x7fffffff7fffffff;
                        auVar20._12_4_ = 0x7fffffff;
                        auVar69 = vandps_avx512vl(auVar68,auVar20);
                        fVar77 = fVar95 - fVar77;
                        auVar21._8_4_ = 0x7f7fffff;
                        auVar21._0_8_ = 0x7f7fffff7f7fffff;
                        auVar21._12_4_ = 0x7f7fffff;
                        uVar64 = vpcmpgtd_avx512vl(auVar69,auVar21);
                        if ((((uVar64 & 1) == 0) && (((uVar64 & 0xf) >> 1 & 1) == 0)) &&
                           ((uint)ABS(fVar77) < 0x7f800000)) {
                          fVar10 = auVar68._0_4_;
                          auVar84._0_4_ = fVar10 * fVar10;
                          fVar11 = auVar68._4_4_;
                          auVar84._4_4_ = fVar11 * fVar11;
                          fVar12 = auVar68._8_4_;
                          auVar84._8_4_ = fVar12 * fVar12;
                          fVar13 = auVar68._12_4_;
                          auVar84._12_4_ = fVar13 * fVar13;
                          auVar69 = vmovshdup_avx(auVar84);
                          auVar68 = vfmadd231ss_fma(auVar69,auVar68,auVar68);
                          auVar68 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar77),
                                                    ZEXT416((uint)fVar77));
                          auVar68 = vsqrtss_avx(auVar68,auVar68);
                          fVar81 = 1.0 / (auVar68._0_4_ + 1e-12);
                          auStack_1a098._0_4_ = fVar10 * fVar81;
                          auStack_1a098._4_4_ = fVar11 * fVar81;
                          auStack_1a098._8_4_ = fVar12 * fVar81;
                          auStack_1a098._12_4_ = fVar13 * fVar81;
                          auVar22._8_4_ = 0x7fffffff;
                          auVar22._0_8_ = 0x7fffffff7fffffff;
                          auVar22._12_4_ = 0x7fffffff;
                          auVar68 = vandps_avx512vl(auStack_1a098,auVar22);
                          auVar23._8_4_ = 0x7f7fffff;
                          auVar23._0_8_ = 0x7f7fffff7f7fffff;
                          auVar23._12_4_ = 0x7f7fffff;
                          uVar64 = vpcmpgtd_avx512vl(auVar68,auVar23);
                          if ((((uVar64 & 1) == 0) && (((uVar64 & 0xf) >> 1 & 1) == 0)) &&
                             ((uint)ABS(fVar77 * fVar81) < 0x7f800000)) {
                            auVar44._8_8_ = 0;
                            auVar44._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
                            auStack_1a0a8._4_12_ = SUB1612(auVar44 << 0x40,4);
                            auStack_1a0a8._0_4_ = fVar77 * fVar81;
                            pdVar59 = pdVar48;
LAB_0085f734:
                            pdVar6 = pdVar59->m_next;
                            auVar68 = auStack_1a0e8._0_16_;
                            lVar52 = pdVar6->m_next->m_incidentVertex * lVar57;
                            dVar3 = (double)vertex[lVar52 + 2];
                            auVar24._8_4_ = 0xffffffff;
                            auVar24._0_8_ = 0x7fffffffffffffff;
                            auVar24._12_4_ = 0x7fffffff;
                            auVar69 = vpandq_avx512vl(*(undefined1 (*) [16])(vertex + lVar52),
                                                      auVar24);
                            auVar25._8_4_ = 0xffffffff;
                            auVar25._0_8_ = 0x7fefffffffffffff;
                            auVar25._12_4_ = 0x7fefffff;
                            uVar64 = vpcmpgtq_avx512vl(auVar69,auVar25);
                            if ((((uVar64 & 1) == 0) && ((uVar64 & 3) >> 1 == 0)) &&
                               ((!NAN((double)vertex[lVar52 + 1]) &&
                                (((ulong)ABS(dVar3) < 0x7ff0000000000000 && (!NAN(dVar3))))))) {
                              fVar77 = (float)dVar3;
                              auVar69 = vcvtpd2ps_avx(*(undefined1 (*) [16])(vertex + lVar52));
                              auVar26._8_4_ = 0x7fffffff;
                              auVar26._0_8_ = 0x7fffffff7fffffff;
                              auVar26._12_4_ = 0x7fffffff;
                              auVar70 = vpandd_avx512vl(auVar69,auVar26);
                              auVar27._8_4_ = 0x7f7fffff;
                              auVar27._0_8_ = 0x7f7fffff7f7fffff;
                              auVar27._12_4_ = 0x7f7fffff;
                              uVar64 = vpcmpgtd_avx512vl(auVar70,auVar27);
                              auStack_1a0e8._0_16_ = auVar69;
                              if (((uVar64 & 1) == 0) &&
                                 ((((((uVar64 & 0xf) >> 1 & 1) == 0 &&
                                    (auVar70 = vmovshdup_avx(auVar69), !NAN(auVar70._0_4_))) &&
                                   ((uint)ABS(fVar77) < 0x7f800000)) && (!NAN(fVar77))))) {
                                auVar68 = vsubps_avx(auVar69,auVar68);
                                auVar28._8_4_ = 0x7fffffff;
                                auVar28._0_8_ = 0x7fffffff7fffffff;
                                auVar28._12_4_ = 0x7fffffff;
                                auVar69 = vandps_avx512vl(auVar68,auVar28);
                                fVar95 = fVar77 - fVar95;
                                auVar29._8_4_ = 0x7f7fffff;
                                auVar29._0_8_ = 0x7f7fffff7f7fffff;
                                auVar29._12_4_ = 0x7f7fffff;
                                uVar64 = vpcmpgtd_avx512vl(auVar69,auVar29);
                                if ((((uVar64 & 1) == 0) && (((uVar64 & 0xf) >> 1 & 1) == 0)) &&
                                   ((uint)ABS(fVar95) < 0x7f800000)) {
                                  fVar10 = auVar68._0_4_;
                                  auVar85._0_4_ = fVar10 * fVar10;
                                  fVar11 = auVar68._4_4_;
                                  auVar85._4_4_ = fVar11 * fVar11;
                                  fVar12 = auVar68._8_4_;
                                  auVar85._8_4_ = fVar12 * fVar12;
                                  fVar13 = auVar68._12_4_;
                                  auVar85._12_4_ = fVar13 * fVar13;
                                  auVar69 = vmovshdup_avx(auVar85);
                                  auVar68 = vfmadd231ss_fma(auVar69,auVar68,auVar68);
                                  auVar68 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar95),
                                                            ZEXT416((uint)fVar95));
                                  auVar68 = vsqrtss_avx(auVar68,auVar68);
                                  fVar81 = 1.0 / (auVar68._0_4_ + 1e-12);
                                  fVar95 = fVar95 * fVar81;
                                  auStack_1a0f8._0_4_ = fVar10 * fVar81;
                                  auStack_1a0f8._4_4_ = fVar11 * fVar81;
                                  auStack_1a0f8._8_4_ = fVar12 * fVar81;
                                  auStack_1a0f8._12_4_ = fVar13 * fVar81;
                                  auVar30._8_4_ = 0x7fffffff;
                                  auVar30._0_8_ = 0x7fffffff7fffffff;
                                  auVar30._12_4_ = 0x7fffffff;
                                  auVar68 = vandps_avx512vl(auStack_1a0f8,auVar30);
                                  auVar31._8_4_ = 0x7f7fffff;
                                  auVar31._0_8_ = 0x7f7fffff7f7fffff;
                                  auVar31._12_4_ = 0x7f7fffff;
                                  uVar64 = vpcmpgtd_avx512vl(auVar68,auVar31);
                                  if ((((uVar64 & 1) == 0) && (((uVar64 & 0xf) >> 1 & 1) == 0)) &&
                                     ((uint)ABS(fVar95) < 0x7f800000)) {
                                    auVar72._0_4_ = auStack_1a098._0_4_ * auStack_1a0f8._0_4_;
                                    auVar72._4_4_ = auStack_1a098._4_4_ * auStack_1a0f8._4_4_;
                                    auVar72._8_4_ = auStack_1a098._8_4_ * auStack_1a0f8._8_4_;
                                    auVar72._12_4_ = auStack_1a098._12_4_ * auStack_1a0f8._12_4_;
                                    auVar68 = vmovshdup_avx(auVar72);
                                    auVar68 = vfmadd231ss_fma(auVar68,auStack_1a0f8,auStack_1a098);
                                    auVar68 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar95),
                                                              ZEXT416((uint)auStack_1a0a8._0_4_));
                                    if (auVar68._0_4_ <= 0.9999) {
                                      bVar47 = false;
                                      auStack_1a0a8._8_8_ = 0;
                                      auStack_1a0a8._0_8_ = CONCAT44(0,fVar95);
                                      pdVar59 = pdVar6;
                                      auStack_1a098 = auStack_1a0f8;
                                    }
                                    else {
                                      pdVar53 = pdVar59->m_twin;
                                      uStack_1a070 = 0;
                                      pdVar49 = pdVar6->m_twin->m_next;
                                      pdVar48 = pdVar6;
                                      uStack_1a078 = CONCAT44(0,fVar95);
                                      while (pdVar49 != pdVar53) {
                                        DeleteEdge(&dStack_1a130,pdVar49);
                                        pdVar48 = pdVar59->m_next;
                                        pdVar53 = pdVar59->m_twin;
                                        pdVar49 = pdVar48->m_twin->m_next;
                                      }
                                      pdVar6 = pdVar53->m_next;
                                      if (pdVar6->m_next->m_next == pdVar53) {
                                        if (pdVar6->m_incidentFace < 1) {
                                          __assert_fail("ptr->m_twin->m_next->m_incidentFace > 0",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                                  ,0xdf8,
                                                  "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                                  );
                                        }
                                        DeleteEdge(&dStack_1a130,pdVar6);
                                        pdVar48 = pdVar59->m_next;
                                      }
                                      pdVar6 = pdVar48->m_twin;
                                      if (pdVar6->m_next->m_twin != pdVar59) {
                                        __assert_fail("ptr->m_next->m_twin->m_next->m_twin == ptr",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                                  ,0xdfc,
                                                  "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                                  );
                                      }
                                      if (dStack_1a130.super_dgTree<dgEdge,_long>.m_head !=
                                          (dgTreeNode *)0x0) {
                                        uVar64 = (long)pdVar59->m_incidentVertex << 0x20 |
                                                 (long)pdVar6->m_incidentVertex;
                                        pdVar54 = dStack_1a130.super_dgTree<dgEdge,_long>.m_head;
                                        do {
                                          lVar52 = 8;
                                          if ((pdVar54->m_key <= (long)uVar64) &&
                                             (lVar52 = 0x10, (long)uVar64 <= pdVar54->m_key))
                                          goto LAB_0085fac3;
                                          pdVar54 = *(dgTreeNode **)
                                                     ((long)&(pdVar54->super_dgRedBackNode).
                                                             _vptr_dgRedBackNode + lVar52);
                                        } while (pdVar54 != (dgTreeNode *)0x0);
                                        uVar64 = (long)pdVar6->m_incidentVertex << 0x20 |
                                                 (long)pdVar59->m_incidentVertex;
                                        pdVar54 = dStack_1a130.super_dgTree<dgEdge,_long>.m_head;
                                        do {
                                          lVar52 = 8;
                                          if ((pdVar54->m_key <= (long)uVar64) &&
                                             (lVar52 = 0x10, (long)uVar64 <= pdVar54->m_key))
                                          goto LAB_0085fac3;
                                          pdVar54 = *(dgTreeNode **)
                                                     ((long)&(pdVar54->super_dgRedBackNode).
                                                             _vptr_dgRedBackNode + lVar52);
                                        } while (pdVar54 != (dgTreeNode *)0x0);
                                      }
                                      pdVar53 = pdVar59->m_twin;
                                      pdVar49 = pdVar6->m_prev;
                                      pdVar53->m_prev = pdVar49;
                                      pdVar49->m_next = pdVar53;
                                      pdVar53 = pdVar48->m_next;
                                      pdVar53->m_prev = pdVar59;
                                      pdVar59->m_next = pdVar53;
                                      pdVar48->m_next = pdVar6;
                                      pdVar48->m_prev = pdVar6;
                                      pdVar6->m_next = pdVar48;
                                      pdVar6->m_prev = pdVar48;
                                      DeleteEdge(&dStack_1a130,pdVar48);
                                      bVar47 = true;
                                      ChangeEdgeIncidentVertex
                                                (&dStack_1a130,pdVar59->m_twin,
                                                 pdVar59->m_next->m_incidentVertex);
                                      pdVar48 = pdVar59;
                                    }
                                    goto LAB_0085faea;
                                  }
                                }
                                goto LAB_008603b5;
                              }
                              goto LAB_00860412;
                            }
                            goto LAB_008603f3;
                          }
                        }
LAB_008603b5:
                        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                      ,0x121,
                                      "dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
                      }
                    }
LAB_00860412:
                    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                  ,0x12d,"dgVector::dgVector(const dgBigVector &)");
                  }
                  goto LAB_008603f3;
                }
              }
LAB_0085fb18:
              iVar58 = dStack_1a130.m_edgeMark + 1;
              dStack_1a130.m_edgeMark = iVar58;
              if (iVar58 == 0x7fffffff) goto LAB_008604b0;
              adStack_1a038[0].super_dgTemplateVector<double>.m_y = (double)&dStack_1a130;
              if (dStack_1a130.super_dgTree<dgEdge,_long>.m_head != (dgTreeNode *)0x0) {
                pdVar50 = dgRedBackNode::Minimum
                                    (&(dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->
                                      super_dgRedBackNode);
                adStack_1a038[0].super_dgTemplateVector<double>.m_x = (double)pdVar50;
                if (pdVar50 != (dgRedBackNode *)0x0) {
                  uVar66 = 0;
                  do {
                    if (((*(int *)&pdVar50[2]._vptr_dgRedBackNode != iVar58) &&
                        (0 < *(int *)((long)&pdVar50[1]._vptr_dgRedBackNode + 4))) &&
                       (0 < *(int *)(*(long *)&pdVar50[1].field_0x20 + 4))) {
                      *(int *)(*(long *)&pdVar50[1].field_0x20 + 0x28) = iVar58;
                      if ((int)uVar66 < 0x2000) {
                        lVar52 = (long)(int)uVar66;
                        uVar66 = uVar66 + 1;
                        alStack_10038[lVar52] = (long)(pdVar50 + 1);
                      }
                      else {
                        bVar47 = uVar66 != 0x2000;
                        uVar66 = 0x2000;
                        if (bVar47) {
                          __assert_fail("count <= maxCount",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                        ,0xe2d,
                                        "hacd::HaI32 GetInteriorDiagonals(dgPolyhedra &, dgEdge **const, hacd::HaI32)"
                                       );
                        }
                      }
                    }
                    *(int *)&pdVar50[2]._vptr_dgRedBackNode = iVar58;
                    this_00 = (dgPolyhedra *)0x0;
                    dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)adStack_1a038,0);
                    pdVar50 = (dgRedBackNode *)adStack_1a038[0].super_dgTemplateVector<double>.m_x;
                  } while ((dgRedBackNode *)adStack_1a038[0].super_dgTemplateVector<double>.m_x !=
                           (dgRedBackNode *)0x0);
                  if (uVar66 != 0) {
                    if (((dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->m_info).m_incidentFace <
                        0) {
                      pdVar48 = ((dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->m_info).m_twin;
                    }
                    else {
                      pdVar48 = &(dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->m_info;
                    }
                    if (pdVar48->m_incidentFace < 1) {
                      __assert_fail("edge->m_incidentFace > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xe82,
                                    "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                   );
                    }
                    FaceNormal(adStack_1a038,this_00,pdVar48,vertex,strideInBytes);
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_z;
                    pdVar50 = adStack_1a038[0].super_dgTemplateVector<double>.m_x;
                    auVar86._0_8_ = (double)pdVar50 * (double)pdVar50;
                    pdVar9 = adStack_1a038[0].super_dgTemplateVector<double>.m_y;
                    auVar86._8_8_ = (double)pdVar9 * (double)pdVar9;
                    auVar68 = vshufpd_avx(auVar86,auVar86,1);
                    auVar68 = vfmadd231sd_fma(auVar68,adStack_1a038[0].
                                                      super_dgTemplateVector<double>._0_16_,
                                              adStack_1a038[0].super_dgTemplateVector<double>._0_16_
                                             );
                    auVar68 = vfmadd231sd_fma(auVar68,auVar73,auVar73);
                    auVar68 = vsqrtsd_avx(auVar68,auVar68);
                    dVar82 = 1.0 / auVar68._0_8_;
                    dVar3 = adStack_1a038[0].super_dgTemplateVector<double>.m_z * dVar82;
                    auVar75._8_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_w;
                    auVar75._0_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_w;
                    auVar75._16_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_w;
                    auVar75._24_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_w;
                    IVar88.m_ptr = (dgRedBackNode *)((double)pdVar50 * dVar82);
                    IVar88.m_tree = (dgTree<dgEdge,_long> *)((double)pdVar9 * dVar82);
                    auVar80._8_8_ = dVar3;
                    auVar80._0_8_ = dVar3;
                    auVar80._16_8_ = dVar3;
                    auVar80._24_8_ = dVar3;
                    auVar90 = ZEXT1632((undefined1  [16])IVar88);
                    auVar8 = vblendpd_avx(auVar90,auVar80,4);
                    auVar8 = vblendpd_avx(auVar8,auVar75,8);
                    auVar71._8_4_ = 0xffffffff;
                    auVar71._0_8_ = 0x7fffffffffffffff;
                    auVar71._12_4_ = 0x7fffffff;
                    auVar71._16_8_ = 0x7fffffffffffffff;
                    auVar71._24_8_ = 0x7fffffffffffffff;
                    auVar71 = vandpd_avx512vl(auVar8,auVar71);
                    auVar8._8_4_ = 0xffffffff;
                    auVar8._0_8_ = 0x7fefffffffffffff;
                    auVar8._12_4_ = 0x7fefffff;
                    auVar8._16_8_ = 0x7fefffffffffffff;
                    auVar8._24_8_ = 0x7fefffffffffffff;
                    uVar67 = vpcmpgtq_avx512vl(auVar71,auVar8);
                    if ((uVar67 & 0xf) != 0) goto LAB_0086046f;
                    IStack_1a140.m_ptr = (dgRedBackNode *)0x0;
                    IStack_1a140.m_tree = &dStack_1a130.super_dgTree<dgEdge,_long>;
                    auStack_1a0e8 = auVar90;
                    adStack_1a038[0].super_dgTemplateVector<double>._0_16_ =
                         (undefined1  [16])IVar88;
                    adStack_1a038[0].super_dgTemplateVector<double>.m_z = dVar3;
                    if ((dStack_1a130.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) ||
                       (IStack_1a140.m_ptr =
                             dgRedBackNode::Minimum
                                       (&(dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->
                                         super_dgRedBackNode),
                       IStack_1a140.m_ptr == (dgRedBackNode *)0x0)) {
                      __assert_fail("edge",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xe8f,
                                    "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                   );
                    }
                    auStack_1a0f8 = vpermilpd_avx(auStack_1a0e8._0_16_,1);
                    do {
                      pdVar50 = IStack_1a140.m_ptr;
                      if (*(int *)((long)&IStack_1a140.m_ptr[1]._vptr_dgRedBackNode + 4) < 0) break;
                      dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a140,0);
                    } while (IStack_1a140.m_ptr != (dgRedBackNode *)0x0);
                    HVar46 = dStack_1a130.m_edgeMark;
                    dStack_1a130.m_edgeMark = dStack_1a130.m_edgeMark + 1;
                    if (dStack_1a130.m_edgeMark == 0x7fffffff) goto LAB_008604b0;
                    lVar52 = *(int *)&(pdVar50[1].m_parent)->_vptr_dgRedBackNode * lVar57;
                    if (0x7fefffffffffffff < (ulong)ABS((double)vertex[lVar52])) {
LAB_008603f3:
                      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                    ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
                    }
                    auVar68 = *(undefined1 (*) [16])(vertex + lVar52 + 1);
                    auVar32._8_4_ = 0xffffffff;
                    auVar32._0_8_ = 0x7fffffffffffffff;
                    auVar32._12_4_ = 0x7fffffff;
                    auVar69 = vpandq_avx512vl(auVar68,auVar32);
                    auVar33._8_4_ = 0xffffffff;
                    auVar33._0_8_ = 0x7fefffffffffffff;
                    auVar33._12_4_ = 0x7fefffff;
                    uVar67 = vpcmpgtq_avx512vl(auVar69,auVar33);
                    if ((((uVar67 & 1) != 0) || (NAN(auVar68._0_8_))) ||
                       (((uVar67 & 3) >> 1 != 0 || (NAN((double)vertex[lVar52 + 2])))))
                    goto LAB_008603f3;
                    pdVar50 = pdVar50 + 1;
                    lVar55 = *(int *)&pdVar50->_vptr_dgRedBackNode * lVar57;
                    dVar82 = (double)vertex[lVar55];
                    if (0x7fefffffffffffff < (ulong)ABS(dVar82)) goto LAB_008603f3;
                    auVar69 = *(undefined1 (*) [16])(vertex + lVar55 + 1);
                    auVar34._8_4_ = 0xffffffff;
                    auVar34._0_8_ = 0x7fffffffffffffff;
                    auVar34._12_4_ = 0x7fffffff;
                    auVar70 = vpandq_avx512vl(auVar69,auVar34);
                    auVar35._8_4_ = 0xffffffff;
                    auVar35._0_8_ = 0x7fefffffffffffff;
                    auVar35._12_4_ = 0x7fefffff;
                    uVar67 = vpcmpgtq_avx512vl(auVar70,auVar35);
                    if (((((uVar67 & 1) != 0) || (NAN(auVar69._0_8_))) || ((uVar67 & 3) >> 1 != 0))
                       || (NAN((double)vertex[lVar55 + 2]))) goto LAB_008603f3;
                    dVar14 = dVar82 - (double)vertex[lVar52];
                    if (0x7fefffffffffffff < (long)ABS(dVar14)) {
LAB_0086046f:
                      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                    ,0x145,
                                    "dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)"
                                   );
                    }
                    auVar68 = vsubpd_avx(auVar69,auVar68);
                    auVar36._8_4_ = 0xffffffff;
                    auVar36._0_8_ = 0x7fffffffffffffff;
                    auVar36._12_4_ = 0x7fffffff;
                    auVar70 = vandpd_avx512vl(auVar68,auVar36);
                    auVar37._8_4_ = 0xffffffff;
                    auVar37._0_8_ = 0x7fefffffffffffff;
                    auVar37._12_4_ = 0x7fefffff;
                    uVar67 = vpcmpgtq_avx512vl(auVar70,auVar37);
                    if (((uVar67 & 1) != 0) || ((uVar67 & 3) >> 1 != 0)) goto LAB_0086046f;
                    dVar83 = auVar68._0_8_;
                    auVar70 = vshufpd_avx(auVar68,auVar68,1);
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = dVar14;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = dVar83 * dVar83;
                    auVar15 = vfmadd231sd_fma(auVar93,auVar74,auVar74);
                    auVar70 = vfmadd213sd_fma(auVar70,auVar70,auVar15);
                    auVar70 = vsqrtsd_avx(auVar70,auVar70);
                    dVar91 = (double)(1.0 / ((float)auVar70._0_8_ + 1e-14));
                    auVar76 = ZEXT864((ulong)(dVar14 * dVar91));
                    if (0x7fefffffffffffff < (long)ABS(dVar14 * dVar91)) goto LAB_0086046f;
                    auVar87._0_8_ = dVar83 * dVar91;
                    auVar87._8_8_ = auVar68._8_8_ * dVar91;
                    auVar38._8_4_ = 0xffffffff;
                    auVar38._0_8_ = 0x7fffffffffffffff;
                    auVar38._12_4_ = 0x7fffffff;
                    auVar68 = vandpd_avx512vl(auVar87,auVar38);
                    auVar39._8_4_ = 0xffffffff;
                    auVar39._0_8_ = 0x7fefffffffffffff;
                    auVar39._12_4_ = 0x7fefffff;
                    uVar67 = vpcmpgtq_avx512vl(auVar68,auVar39);
                    if (((uVar67 & 1) != 0) || ((uVar67 & 3) >> 1 != 0)) goto LAB_0086046f;
                    auVar97 = vshufpd_avx(auVar87,auVar87,1);
                    pdVar56 = pdVar50;
                    do {
                      pdVar7 = pdVar56->m_right;
                      lVar52 = *(int *)&pdVar7->_vptr_dgRedBackNode * lVar57;
                      dVar14 = (double)vertex[lVar52];
                      if (0x7fefffffffffffff < (ulong)ABS(dVar14)) goto LAB_008603f3;
                      auVar68 = *(undefined1 (*) [16])(vertex + lVar52 + 1);
                      auVar40._8_4_ = 0xffffffff;
                      auVar40._0_8_ = 0x7fffffffffffffff;
                      auVar40._12_4_ = 0x7fffffff;
                      auVar70 = vpandq_avx512vl(auVar68,auVar40);
                      auVar41._8_4_ = 0xffffffff;
                      auVar41._0_8_ = 0x7fefffffffffffff;
                      auVar41._12_4_ = 0x7fefffff;
                      uVar67 = vpcmpgtq_avx512vl(auVar70,auVar41);
                      if (((((uVar67 & 1) != 0) || (NAN(auVar68._0_8_))) || ((uVar67 & 3) >> 1 != 0)
                          ) || (NAN((double)vertex[lVar52 + 2]))) goto LAB_008603f3;
                      dVar82 = dVar14 - dVar82;
                      if (0x7fefffffffffffff < (long)ABS(dVar82)) goto LAB_0086046f;
                      auVar69 = vsubpd_avx(auVar68,auVar69);
                      auVar42._8_4_ = 0xffffffff;
                      auVar42._0_8_ = 0x7fffffffffffffff;
                      auVar42._12_4_ = 0x7fffffff;
                      auVar70 = vandpd_avx512vl(auVar69,auVar42);
                      auVar43._8_4_ = 0xffffffff;
                      auVar43._0_8_ = 0x7fefffffffffffff;
                      auVar43._12_4_ = 0x7fefffff;
                      uVar67 = vpcmpgtq_avx512vl(auVar70,auVar43);
                      if (((uVar67 & 1) != 0) || ((uVar67 & 3) >> 1 != 0)) goto LAB_0086046f;
                      dVar83 = auVar69._0_8_;
                      auVar69 = vshufpd_avx(auVar69,auVar69,1);
                      auVar78._8_8_ = 0;
                      auVar78._0_8_ = dVar82;
                      auVar96._8_8_ = 0;
                      auVar96._0_8_ = dVar83 * dVar83;
                      auVar70 = vfmadd231sd_fma(auVar96,auVar78,auVar78);
                      auVar70 = vfmadd231sd_fma(auVar70,auVar69,auVar69);
                      auVar70 = vsqrtsd_avx(auVar70,auVar70);
                      dVar91 = 1.0 / (auVar70._0_8_ + 9.9999998245167e-15);
                      dVar83 = dVar83 * dVar91;
                      dVar82 = dVar82 * dVar91;
                      dVar91 = auVar69._0_8_ * dVar91;
                      if ((0x7fefffffffffffff < (long)ABS(dVar82)) ||
                         ((0x7fefffffffffffff < (long)ABS(dVar83) ||
                          (0x7fefffffffffffff < (long)ABS(dVar91))))) goto LAB_0086046f;
                      dVar92 = auVar97._0_8_;
                      auVar79._8_8_ = 0;
                      auVar79._0_8_ = dVar82;
                      auVar99._8_8_ = 0;
                      auVar99._0_8_ = dVar91 * auVar76._0_8_;
                      auVar69 = vfmsub231sd_fma(auVar99,auVar79,auVar97);
                      auVar97._8_8_ = 0;
                      auVar97._0_8_ = dVar91;
                      auVar98._8_8_ = 0;
                      auVar98._0_8_ = dVar83 * dVar92;
                      auVar70 = vfmsub231sd_fma(auVar98,auVar87,auVar97);
                      dVar91 = auVar87._0_8_;
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = auStack_1a0e8._0_8_;
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = auVar69._0_8_ * (double)auStack_1a0f8._0_8_;
                      auVar69 = vfmadd231sd_fma(auVar94,auVar70,auVar4);
                      auVar87._8_8_ = 0.0;
                      auVar87._0_8_ = dVar83;
                      auVar89._8_8_ = 0;
                      auVar89._0_8_ = dVar82 * dVar91;
                      auVar70 = vfmsub231sd_fma(auVar89,auVar87,auVar76._0_16_);
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = dVar3;
                      auVar69 = vfmadd231sd_fma(auVar69,auVar70,auVar5);
                      if (0.004999999888241291 < auVar69._0_8_) goto LAB_008601ea;
                      *(HaI32 *)&pdVar56[1]._vptr_dgRedBackNode = dStack_1a130.m_edgeMark;
                      auVar76 = ZEXT1664(auVar79);
                      pdVar56 = pdVar7;
                      dVar82 = dVar14;
                      auVar69 = auVar68;
                    } while (pdVar7 != pdVar50);
                    IStack_1a0b8.m_ptr = (dgRedBackNode *)0x0;
                    IStack_1a0b8.m_tree = &dStack_1a130.super_dgTree<dgEdge,_long>;
                    if (dStack_1a130.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                      IStack_1a0b8.m_ptr = (dgRedBackNode *)0x0;
                    }
                    else {
                      IStack_1a0b8.m_ptr =
                           dgRedBackNode::Minimum
                                     (&(dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->
                                       super_dgRedBackNode);
                    }
                    while (IStack_1a0b8.m_ptr != (dgRedBackNode *)0x0) {
                      if ((*(int *)((long)&IStack_1a0b8.m_ptr[1]._vptr_dgRedBackNode + 4) < 0) &&
                         (*(int *)&IStack_1a0b8.m_ptr[2]._vptr_dgRedBackNode <= HVar46))
                      goto LAB_008601ea;
                      dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a0b8,0);
                    }
                    if (2 < (int)uVar66) {
                      lVar57 = -1;
                      uVar51 = 1;
                      pdVar56 = pdVar50;
                      uVar63 = 0;
                      do {
                        uVar61 = uVar63;
                        aiStack_18034[lVar57] = *(int *)&pdVar56->_vptr_dgRedBackNode;
                        if (lVar57 == 0x1ffe) {
                          __assert_fail("count < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                        ,0xebe,
                                        "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                       );
                        }
                        pdVar56 = pdVar56->m_right;
                        lVar57 = lVar57 + 1;
                        uVar51 = uVar51 + 1;
                        uVar63 = uVar61 + 1;
                      } while (pdVar56 != pdVar50);
                      if (lVar57 != 0) {
                        uVar60 = 0;
                        uVar63 = 0;
LAB_00860183:
                        piVar65 = aiStack_18034;
                        auStack_1a0e8._0_4_ = (int)uVar60;
                        auVar8 = auStack_1a0e8;
                        uVar67 = (ulong)uVar63;
                        lVar52 = 0;
                        do {
                          uVar62 = uVar63;
                          if ((int)uVar63 < (int)uVar61) {
                            uVar62 = uVar61;
                          }
                          uVar64 = uVar67;
                          while ((ulong)uVar62 + lVar52 != uVar64) {
                            uVar1 = uVar64 + 1;
                            piVar2 = piVar65 + uVar64;
                            uVar64 = uVar1;
                            if (aiStack_18034[(long)(int)uVar63 + -1] == *piVar2) {
                              uVar60 = CONCAT71((int7)(uVar1 >> 8),1);
                              uVar63 = uVar51;
                              auStack_1a0e8 = auVar8;
                              if ((int)lVar57 <= (int)uVar51) goto LAB_008601ea;
                              goto LAB_00860183;
                            }
                          }
                          uVar63 = uVar63 + 1;
                          lVar52 = lVar52 + -1;
                          piVar65 = piVar65 + 1;
                        } while ((int)uVar63 < (int)lVar57);
                        auStack_1a0e8[0] = (char)uVar60;
                        bVar47 = auStack_1a0e8[0] != '\0';
                        auStack_1a0e8 = auVar8;
                        if (bVar47) {
LAB_008601ea:
                          this = pdStack_1a0c0;
                          if (0 < (int)uVar66) {
                            uVar67 = 0;
                            do {
                              pdVar48 = (dgEdge *)alStack_10038[uVar67];
                              bVar47 = IsEssensialPointDiagonal(pdVar48,adStack_1a038,vertex,stride)
                              ;
                              if ((!bVar47) &&
                                 (bVar47 = IsEssensialPointDiagonal
                                                     (pdVar48->m_twin,adStack_1a038,vertex,stride),
                                 !bVar47)) {
                                DeleteEdge(&dStack_1a130,pdVar48);
                              }
                              uVar67 = uVar67 + 1;
                              this = pdStack_1a0c0;
                            } while (uVar66 != uVar67);
                          }
                          goto LAB_00860271;
                        }
                      }
                    }
                    this = pdStack_1a0c0;
                    if (0 < (int)uVar66) {
                      uVar67 = 0;
                      do {
                        DeleteEdge(&dStack_1a130,(dgEdge *)alStack_10038[uVar67]);
                        uVar67 = uVar67 + 1;
                        this = pdStack_1a0c0;
                      } while (uVar66 != uVar67);
                    }
                  }
                }
              }
LAB_00860271:
              iVar58 = dStack_1a130.m_edgeMark + 1;
              dStack_1a130.m_edgeMark = iVar58;
              if (iVar58 == 0x7fffffff) {
LAB_008604b0:
                __assert_fail("m_edgeMark < 0x7fffffff",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                              ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
              }
              auVar45._8_8_ = 0;
              auVar45._0_8_ = &dStack_1a130;
              adStack_1a038[0].super_dgTemplateVector<double>._0_16_ = auVar45 << 0x40;
              if (dStack_1a130.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                pdVar50 = (dgRedBackNode *)0x0;
                adStack_1a038[0].super_dgTemplateVector<double>.m_y = (double)&dStack_1a130;
              }
              else {
                pdVar50 = dgRedBackNode::Minimum
                                    (&(dStack_1a130.super_dgTree<dgEdge,_long>.m_head)->
                                      super_dgRedBackNode);
              }
              adStack_1a038[0].super_dgTemplateVector<double>.m_x = (double)pdVar50;
              while (pdVar50 != (dgRedBackNode *)0x0) {
                if ((*(int *)&pdVar50[2]._vptr_dgRedBackNode != iVar58) &&
                   (0 < *(int *)((long)&pdVar50[1]._vptr_dgRedBackNode + 4))) {
                  pdVar56 = pdVar50 + 1;
                  uVar67 = 0;
                  do {
                    uVar64 = uVar67;
                    aiStack_18034[uVar64 - 1] = *(int *)&pdVar56->_vptr_dgRedBackNode;
                    if (uVar64 == 0x1fff) {
                      __assert_fail("diagonalCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xeea,
                                    "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                   );
                    }
                    *(int *)&pdVar56[1]._vptr_dgRedBackNode = iVar58;
                    pdVar56 = pdVar56->m_right;
                    uVar67 = uVar64 + 1;
                  } while (pdVar56 != pdVar50 + 1);
                  if (1 < uVar64) {
                    AddFace(&dStack_1a060,(HaI32)(uVar64 + 1),&HStack_18038,(HaI64 *)0x0);
                  }
                }
                dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)adStack_1a038,0);
                pdVar50 = (dgRedBackNode *)adStack_1a038[0].super_dgTemplateVector<double>.m_x;
              }
            }
            pdVar54 = ((dgTree<dgEdge,_long> *)&(IStack_1a108.m_tree)->_vptr_dgTree)->m_head;
            if (pdVar54 == (dgTreeNode *)0x0) {
              IStack_1a108.m_ptr = (dgRedBackNode *)0x0;
            }
            else {
              IStack_1a108.m_ptr = dgRedBackNode::Minimum(&pdVar54->super_dgRedBackNode);
            }
            ~dgPolyhedra(&dStack_1a130);
          }
        } while (IStack_1a108.m_ptr != (dgRedBackNode *)0x0);
      }
      EndFace(&dStack_1a060);
      if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
        __assert_fail("GetCount() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xefa,
                      "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                     );
      }
      pdVar54 = (this->super_dgTree<dgEdge,_long>).m_head;
      (this->super_dgTree<dgEdge,_long>).m_head = dStack_1a060.super_dgTree<dgEdge,_long>.m_head;
      (this->super_dgTree<dgEdge,_long>).m_count = dStack_1a060.super_dgTree<dgEdge,_long>.m_count;
      dStack_1a060.super_dgTree<dgEdge,_long>.m_count = 0;
      dStack_1a060.super_dgTree<dgEdge,_long>.m_head = pdVar54;
      ~dgPolyhedra(&dStack_1a060);
    }
  }
  return;
LAB_0085fac3:
  auStack_1a0a8._8_8_ = uStack_1a070;
  auStack_1a0a8._0_8_ = uStack_1a078;
  bVar47 = false;
  auStack_1a098 = auStack_1a0f8;
  pdVar59 = pdVar48;
LAB_0085faea:
  fVar95 = fVar77;
  if (pdVar59 == pdVar48 && !bVar47) goto code_r0x0085fb07;
  goto LAB_0085f734;
code_r0x0085fb07:
  uVar67 = uVar67 + 1;
  this = pdStack_1a0c0;
  if (uVar67 == uStack_1a080) goto LAB_0085fb18;
  goto LAB_0085f423;
}

Assistant:

void dgPolyhedra::ConvexPartition (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes, dgPolyhedra* const leftOversOut)
{
	if (GetCount()) {
		Triangulate (vertex, strideInBytes, leftOversOut);
		DeleteDegenerateFaces (vertex, strideInBytes, hacd::HaF32 (1.0e-5f));
		Optimize (vertex, strideInBytes, hacd::HaF32 (1.0e-4f));
		DeleteDegenerateFaces (vertex, strideInBytes, hacd::HaF32 (1.0e-5f));

		if (GetCount()) {
			hacd::HaI32 removeCount = 0;
			hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

			hacd::HaI32 polygon[1024 * 8];
			dgEdge* diagonalsPool[1024 * 8];
			dgPolyhedra buildConvex;

			buildConvex.BeginFace();
			dgPolyhedra::Iterator iter (*this);
			for (iter.Begin(); iter; ) {
				dgEdge* edge = &(*iter);
				iter++;
				if (edge->m_incidentFace > 0) {

					dgPolyhedra flatFace;
					MarkAdjacentCoplanarFaces (flatFace, edge, vertex, strideInBytes);

					if (flatFace.GetCount()) {
						flatFace.RefineTriangulation (vertex, stride);
						RemoveColinearVertices (flatFace, vertex, stride);

						hacd::HaI32 diagonalCount = GetInteriorDiagonals (flatFace, diagonalsPool, sizeof (diagonalsPool) / sizeof (diagonalsPool[0]));
						if (diagonalCount) {
							edge = &flatFace.GetRoot()->GetInfo();
							if (edge->m_incidentFace < 0) {
								edge = edge->m_twin;
							}
							HACD_ASSERT (edge->m_incidentFace > 0);

							dgBigVector normal (FaceNormal (edge, vertex, strideInBytes));
							normal = normal.Scale (hacd::HaF64 (1.0f) / sqrt (normal % normal));

							edge = NULL;
							dgPolyhedra::Iterator iter (flatFace);
							for (iter.Begin(); iter; iter ++) {
								edge = &(*iter);
								if (edge->m_incidentFace < 0) {
									break;
								}
							}
							HACD_ASSERT (edge);

							hacd::HaI32 isConvex = 1;
							dgEdge* ptr = edge;
							hacd::HaI32 mark = flatFace.IncLRU();

							dgBigVector normal2 (normal);
							dgBigVector p0 (&vertex[ptr->m_prev->m_incidentVertex * stride]);
							dgBigVector p1 (&vertex[ptr->m_incidentVertex * stride]);
							dgBigVector e0 (p1 - p0);
							e0 = e0.Scale (hacd::HaF32 (1.0f) / (dgSqrt (e0 % e0) + hacd::HaF32 (1.0e-14f)));
							do {
								dgBigVector p2 (&vertex[ptr->m_next->m_incidentVertex * stride]);
								dgBigVector e1 (p2 - p1);
								e1 = e1.Scale (hacd::HaF32 (1.0f) / (sqrt (e1 % e1) + hacd::HaF32 (1.0e-14f)));
								hacd::HaF64 dot = (e0 * e1) % normal2;
								//if (dot > hacd::HaF32 (0.0f)) {
								if (dot > hacd::HaF32 (5.0e-3f)) {
									isConvex = 0;
									break;
								}
								ptr->m_mark = mark;
								e0 = e1;
								p1 = p2;
								ptr = ptr->m_next;
							} while (ptr != edge);

							if (isConvex) {
								dgPolyhedra::Iterator iter (flatFace);
								for (iter.Begin(); iter; iter ++) {
									ptr = &(*iter);
									if (ptr->m_incidentFace < 0) {
										if (ptr->m_mark < mark) {
											isConvex = 0;
											break;
										}
									}
								}
							}

							if (isConvex) {
								if (diagonalCount > 2) {
									hacd::HaI32 count = 0;
									ptr = edge;
									do {
										polygon[count] = ptr->m_incidentVertex;				
										count ++;
										HACD_ASSERT (count < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
										ptr = ptr->m_next;
									} while (ptr != edge);

									for (hacd::HaI32 i = 0; i < count - 1; i ++) {
										for (hacd::HaI32 j = i + 1; j < count; j ++) {
											if (polygon[i] == polygon[j]) {
												i = count;
												isConvex = 0;
												break ;
											}
										}
									}
								}
							}

							if (isConvex) {
								for (hacd::HaI32 j = 0; j < diagonalCount; j ++) {
									dgEdge* const diagonal = diagonalsPool[j];
									removeCount ++;
									flatFace.DeleteEdge (diagonal);
								}
							} else {
								for (hacd::HaI32 j = 0; j < diagonalCount; j ++) {
									dgEdge* const diagonal = diagonalsPool[j];
									if (!IsEssensialDiagonal(diagonal, normal, vertex, stride)) {
										removeCount ++;
										flatFace.DeleteEdge (diagonal);
									}
								}
							}
						}

						hacd::HaI32 mark = flatFace.IncLRU();
						dgPolyhedra::Iterator iter (flatFace);
						for (iter.Begin(); iter; iter ++) {
							dgEdge* const edge = &(*iter);
							if (edge->m_mark != mark) {
								if (edge->m_incidentFace > 0) {
									dgEdge* ptr = edge;
									hacd::HaI32 diagonalCount = 0;
									do {
										polygon[diagonalCount] = ptr->m_incidentVertex;				
										diagonalCount ++;
										HACD_ASSERT (diagonalCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
										ptr->m_mark = mark;
										ptr = ptr->m_next;
									} while (ptr != edge);
									if (diagonalCount >= 3) {
										buildConvex.AddFace (diagonalCount, polygon);
									}
								}
							}
						}
					}
					iter.Begin();
				}
			}

			buildConvex.EndFace();
			HACD_ASSERT (GetCount() == 0);
			SwapInfo(buildConvex);
		}
	}
}